

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImDrawCmd * __thiscall
ImVector<ImDrawCmd>::insert(ImVector<ImDrawCmd> *this,ImDrawCmd *it,ImDrawCmd *v)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  ImDrawCmd *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ImTextureID pvVar7;
  undefined8 uVar8;
  ImDrawCallback p_Var9;
  long lVar10;
  ImDrawCmd *__dest;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  
  __dest = this->Data;
  if (__dest <= it) {
    iVar3 = this->Size;
    lVar10 = (long)iVar3;
    if (it <= __dest + lVar10) {
      lVar13 = (long)it - (long)__dest;
      if (iVar3 == this->Capacity) {
        if (iVar3 == 0) {
          iVar12 = 8;
        }
        else {
          iVar12 = iVar3 / 2 + iVar3;
        }
        iVar14 = iVar3 + 1;
        if (iVar3 + 1 < iVar12) {
          iVar14 = iVar12;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImDrawCmd *)(*GImAllocatorAllocFunc)((long)iVar14 * 0x38,GImAllocatorUserData);
        if (this->Data != (ImDrawCmd *)0x0) {
          memcpy(__dest,this->Data,(long)this->Size * 0x38);
          pIVar4 = this->Data;
          if ((pIVar4 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        this->Data = __dest;
        this->Capacity = iVar14;
        lVar10 = (long)this->Size;
      }
      lVar11 = lVar10 + (lVar13 >> 3) * -0x6db6db6db6db6db7;
      if (lVar11 != 0 && (lVar13 >> 3) * 0x6db6db6db6db6db7 <= lVar10) {
        memmove((void *)((long)__dest + lVar13 + 0x38),(void *)((long)__dest + lVar13),lVar11 * 0x38
               );
        __dest = this->Data;
      }
      *(void **)((long)__dest + lVar13 + 0x30) = v->UserCallbackData;
      uVar5 = *(undefined8 *)&v->ClipRect;
      uVar6 = *(undefined8 *)&(v->ClipRect).z;
      pvVar7 = v->TextureId;
      uVar8 = *(undefined8 *)&v->VtxOffset;
      p_Var9 = v->UserCallback;
      puVar2 = (undefined8 *)((long)__dest + lVar13 + 0x20);
      *puVar2 = *(undefined8 *)&v->ElemCount;
      puVar2[1] = p_Var9;
      puVar2 = (undefined8 *)((long)__dest + lVar13 + 0x10);
      *puVar2 = pvVar7;
      puVar2[1] = uVar8;
      *(undefined8 *)((long)__dest + lVar13) = uVar5;
      ((undefined8 *)((long)__dest + lVar13))[1] = uVar6;
      this->Size = this->Size + 1;
      return (ImDrawCmd *)(lVar13 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data + Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                ,0x71e,"T *ImVector<ImDrawCmd>::insert(const T *, const T &) [T = ImDrawCmd]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }